

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O2

bool __thiscall NaPNDelay::activate(NaPNDelay *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  
  bVar1 = awake(this);
  this->bAwaken = bVar1;
  if (bVar1) {
    iVar2 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
    if ((char)iVar2 != '\0') {
      pcVar4 = NaPetriNode::name(&this->super_NaPetriNode);
      uVar3 = NaPetriNode::activations(&this->super_NaPetriNode);
      NaPrintLog("node \'%s\' is awaken: activations=%d, delay=",pcVar4,(ulong)uVar3);
      uVar5 = 0;
      while (uVar5 < (uint)this->nOutDim) {
        pcVar4 = "%d,";
        if (uVar5 + 1 == (ulong)(uint)this->nOutDim) {
          pcVar4 = "%d\n";
        }
        NaPrintLog(pcVar4,(ulong)this->piOutMap[uVar5]);
        uVar5 = uVar5 + 1;
      }
    }
  }
  bVar1 = NaPetriCnInput::is_waiting(&this->in);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (this->bAwaken == true) {
      bVar1 = NaPetriCnOutput::is_waiting(&this->dout);
      bVar1 = !bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool
NaPNDelay::activate ()
{
  // For action() and post_action() only
  bAwaken = awake();

  if(bAwaken && is_verbose())
    {
      unsigned	i;
      NaPrintLog("node '%s' is awaken: activations=%d, delay=",
		 name(), activations());
      for(i = 0; i < nOutDim; ++i)
	if(i + 1 == nOutDim)
	  NaPrintLog("%d\n", piOutMap[i]);
	else
	  NaPrintLog("%d,", piOutMap[i]);
    }

  // Does not depend on bAwaken state and output state, so 
  return !in.is_waiting() &&
    (!bAwaken || (bAwaken && !dout.is_waiting()));
}